

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::ActiveBuiltinHandler::handle_builtin
          (ActiveBuiltinHandler *this,SPIRType *type,BuiltIn builtin,Bitset *decoration_flags)

{
  bool bVar1;
  bool *pbVar2;
  CompilerError *pCVar3;
  uint *puVar4;
  uint32_t array_size_1;
  uint32_t array_size;
  Bitset *decoration_flags_local;
  BuiltIn builtin_local;
  SPIRType *type_local;
  ActiveBuiltinHandler *this_local;
  
  if (builtin == BuiltInClipDistance) {
    pbVar2 = VectorView<bool>::operator[](&(type->array_size_literal).super_VectorView<bool>,0);
    if ((*pbVar2 & 1U) == 0) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"Array size for ClipDistance must be a literal.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar4 = VectorView<unsigned_int>::operator[](&(type->array).super_VectorView<unsigned_int>,0);
    if (*puVar4 == 0) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"Array size for ClipDistance must not be unsized.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this->compiler->clip_distance_count = *puVar4;
  }
  else if (builtin == BuiltInCullDistance) {
    pbVar2 = VectorView<bool>::operator[](&(type->array_size_literal).super_VectorView<bool>,0);
    if ((*pbVar2 & 1U) == 0) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"Array size for CullDistance must be a literal.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar4 = VectorView<unsigned_int>::operator[](&(type->array).super_VectorView<unsigned_int>,0);
    if (*puVar4 == 0) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"Array size for CullDistance must not be unsized.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this->compiler->cull_distance_count = *puVar4;
  }
  else if ((builtin == BuiltInPosition) && (bVar1 = Bitset::get(decoration_flags,0x12), bVar1)) {
    this->compiler->position_invariant = true;
  }
  return;
}

Assistant:

void Compiler::ActiveBuiltinHandler::handle_builtin(const SPIRType &type, BuiltIn builtin,
                                                    const Bitset &decoration_flags)
{
	// If used, we will need to explicitly declare a new array size for these builtins.

	if (builtin == BuiltInClipDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for ClipDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for ClipDistance must not be unsized.");
		compiler.clip_distance_count = array_size;
	}
	else if (builtin == BuiltInCullDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for CullDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for CullDistance must not be unsized.");
		compiler.cull_distance_count = array_size;
	}
	else if (builtin == BuiltInPosition)
	{
		if (decoration_flags.get(DecorationInvariant))
			compiler.position_invariant = true;
	}
}